

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFaceBound,_2UL>::Construct
                   (DB *db,LIST *params)

{
  IfcFaceBound *in;
  
  in = (IfcFaceBound *)operator_new(0x70);
  *(undefined8 *)&in->field_0x60 = 0;
  *(char **)&in->field_0x68 = "IfcFaceBound";
  *(undefined8 *)&(in->super_IfcTopologicalRepresentationItem).field_0x28 = 0;
  *(undefined8 *)&(in->super_IfcTopologicalRepresentationItem).field_0x30 = 0;
  (in->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFaceBound_008a7520;
  *(undefined ***)&in->field_0x58 = &PTR__IfcFaceBound_008a7598;
  *(undefined ***)
   &(in->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcFaceBound_008a7548;
  *(undefined ***)
   &(in->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcFaceBound_008a7570;
  (in->Orientation)._M_dataplus._M_p = (pointer)&(in->Orientation).field_2;
  (in->Orientation)._M_string_length = 0;
  (in->Orientation).field_2._M_local_buf[0] = '\0';
  GenericFill<Assimp::IFC::Schema_2x3::IfcFaceBound>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }